

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,bool *value,bool *defval)

{
  uint uVar1;
  FWriter *pFVar2;
  bool bVar3;
  Value *this;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      if ((*(byte *)((long)&this->data_ + 0x16) & 8) == 0) {
        __assert_fail("val->IsBool()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x499,"FSerializer &Serialize(FSerializer &, const char *, bool &, bool *)");
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool(this);
      *value = bVar3;
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if ((((uVar1 == 0) || (defval == (bool *)0x0)) ||
        ((pFVar2->mInObject).Array[uVar1 - 1] == false)) || (*value != *defval)) {
      FSerializer::WriteKey(arc,key);
      FWriter::Bool(arc->w,*value);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, bool &value, bool *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Bool(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsBool());
			if (val->IsBool())
			{
				value = val->GetBool();
			}
			else
			{
				Printf(TEXTCOLOR_RED "boolean type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}